

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt * __thiscall slang::SVInt::operator^=(SVInt *this,SVInt *rhs)

{
  uint64_t *puVar1;
  bool bVar2;
  SVInt *pSVar3;
  byte bVar4;
  SVInt *in_RSI;
  SVInt *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t words;
  bool bothSigned;
  SVInt *in_stack_ffffffffffffff80;
  SVInt *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint3 in_stack_ffffffffffffff94;
  bitwidth_t bits;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint32_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffe0;
  
  if ((in_RDI->super_SVIntStorage).bitWidth != (in_RSI->super_SVIntStorage).bitWidth) {
    bits = (bitwidth_t)in_stack_ffffffffffffff94;
    if (((in_RDI->super_SVIntStorage).signFlag & 1U) != 0) {
      bits = CONCAT13((in_RSI->super_SVIntStorage).signFlag,in_stack_ffffffffffffff94);
    }
    bVar4 = (byte)(bits >> 0x18) & 1;
    bVar2 = SUB41((uint)in_stack_ffffffffffffff90 >> 0x18,0);
    if ((in_RSI->super_SVIntStorage).bitWidth <= (in_RDI->super_SVIntStorage).bitWidth) {
      extend(in_RDI,bits,bVar2);
      pSVar3 = operator^=(in_RSI,(SVInt *)CONCAT17(bVar4,in_stack_ffffffffffffffe0));
      ~SVInt((SVInt *)CONCAT44(bits,in_stack_ffffffffffffff90));
      return pSVar3;
    }
    extend(in_RDI,bits,bVar2);
    operator=(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    ~SVInt((SVInt *)CONCAT44(bits,in_stack_ffffffffffffff90));
  }
  bVar2 = hasUnknown(in_RDI);
  if ((!bVar2) && (bVar2 = hasUnknown(in_RSI), bVar2)) {
    makeUnknown((SVInt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  bVar2 = isSingleWord(in_RDI);
  if (bVar2) {
    (in_RDI->super_SVIntStorage).field_0.val =
         (in_RSI->super_SVIntStorage).field_0.val ^ (in_RDI->super_SVIntStorage).field_0.val;
  }
  else {
    in_stack_ffffffffffffffb0 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
    if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
      for (local_5c = 0; local_5c < in_stack_ffffffffffffffb0; local_5c = local_5c + 1) {
        puVar1 = (in_RDI->super_SVIntStorage).field_0.pVal;
        puVar1[local_5c] = (in_RSI->super_SVIntStorage).field_0.pVal[local_5c] ^ puVar1[local_5c];
      }
    }
    else {
      bVar2 = isSingleWord(in_RSI);
      if (bVar2) {
        *(in_RDI->super_SVIntStorage).field_0.pVal =
             (*(ulong *)((in_RDI->super_SVIntStorage).field_0.val + 8) ^ 0xffffffffffffffff) &
             (*(in_RDI->super_SVIntStorage).field_0.pVal ^ (in_RSI->super_SVIntStorage).field_0.val)
        ;
      }
      else {
        bVar2 = hasUnknown(in_RSI);
        if (bVar2) {
          for (local_54 = 0; local_54 < in_stack_ffffffffffffffb0; local_54 = local_54 + 1) {
            puVar1 = (in_RDI->super_SVIntStorage).field_0.pVal;
            puVar1[local_54 + in_stack_ffffffffffffffb0] =
                 (in_RSI->super_SVIntStorage).field_0.pVal[local_54 + in_stack_ffffffffffffffb0] |
                 puVar1[local_54 + in_stack_ffffffffffffffb0];
          }
        }
        for (local_58 = 0; local_58 < in_stack_ffffffffffffffb0; local_58 = local_58 + 1) {
          (in_RDI->super_SVIntStorage).field_0.pVal[local_58] =
               ((in_RDI->super_SVIntStorage).field_0.pVal[local_58 + in_stack_ffffffffffffffb0] ^
               0xffffffffffffffff) &
               ((in_RDI->super_SVIntStorage).field_0.pVal[local_58] ^
               (in_RSI->super_SVIntStorage).field_0.pVal[local_58]);
        }
      }
    }
  }
  clearUnusedBits((SVInt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return in_RDI;
}

Assistant:

SVInt& SVInt::operator^=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this ^= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val ^= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord())
                pVal[0] = ~pVal[1] & (pVal[0] ^ rhs.val);
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] |= rhs.pVal[i + words];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] ^ rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] ^= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    return *this;
}